

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
~MemPool(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> *this
        )

{
  size_type segmentSize;
  MemSegment *pMVar1;
  PtrAVLTree *local_38;
  size_type size;
  void *ptr;
  MemSegment *seg;
  MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> *this_local;
  
  ptr = this->m_segList;
  while (ptr != (void *)0x0) {
    segmentSize = MemSegment::getSize((MemSegment *)ptr);
    pMVar1 = MemSegment::getNext((MemSegment *)ptr);
    NoActionMemLogger::logFreeSegment(this->m_logger,ptr,segmentSize);
    CachedArena<cookmem::MallocArena>::freeSegment(this->m_arena,ptr,segmentSize);
    ptr = pMVar1;
  }
  local_38 = (PtrAVLTree *)&this->m_footprint;
  do {
    local_38 = local_38 + -1;
    PtrAVLTree::~PtrAVLTree(local_38);
  } while (local_38 != this->m_largeTrees);
  return;
}

Assistant:

~MemPool()
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            void* ptr = seg;
            size_type size = seg->getSize ();
            seg = seg->getNext ();
            m_logger.logFreeSegment (ptr, size);
            m_arena.freeSegment (ptr, size);
        }
    }